

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::LowerCase(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  undefined8 local_38;
  size_t i;
  string *s_local;
  string *n;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  for (local_38 = 0; uVar2 = std::__cxx11::string::size(), local_38 < uVar2; local_38 = local_38 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    iVar1 = tolower((int)*pcVar3);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar4 = (char)iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::LowerCase(const std::string& s)
{
  std::string n;
  n.resize(s.size());
  for (size_t i = 0; i < s.size(); i++) {
    n[i] = static_cast<std::string::value_type>(tolower(s[i]));
  }
  return n;
}